

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scgi_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::scgi::on_first_read(scgi *this,error_code *e,size_t n,handler *h)

{
  bool bVar1;
  element_type *peVar2;
  reference pvVar3;
  size_type sVar4;
  error_code *in_RCX;
  ulong in_RDX;
  error_code *in_RSI;
  shared_ptr<cppcms::impl::cgi::scgi> *in_RDI;
  size_t size;
  int len;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *c;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  vector<char,_std::allocator<char>_> *this_00;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *in_stack_fffffffffffffed8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffee0;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> in_stack_fffffffffffffee8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  callback local_c0 [48];
  error_code local_90;
  ulong local_80;
  error_code local_78;
  int local_64;
  error_code local_60;
  char *local_50;
  undefined1 local_41;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  error_code *local_20;
  ulong local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    booster::callback<void_(const_std::error_code_&)>::operator()
              ((callback<void_(const_std::error_code_&)> *)in_stack_fffffffffffffef0,
               (error_code *)in_stack_fffffffffffffee8._M_current);
  }
  else {
    local_30 = (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffec8);
    local_40 = (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffec8);
    local_38 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                       operator+(in_stack_fffffffffffffed8,
                                 (difference_type)in_stack_fffffffffffffed0);
    local_41 = 0x3a;
    local_28 = (char *)std::
                       find<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,char>
                                 (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                                  (char *)in_stack_fffffffffffffed8);
    local_50 = (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffec8);
    peVar2 = (element_type *)
             __gnu_cxx::operator-
                       ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
                        in_stack_fffffffffffffed0,
                        (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
                        in_stack_fffffffffffffec8);
    in_RDI[0x11].super___shared_ptr<cppcms::impl::cgi::scgi,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar2;
    if (in_RDI[0x11].super___shared_ptr<cppcms::impl::cgi::scgi,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        < (element_type *)0x10) {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x17),
                          (size_type)
                          in_RDI[0x11].
                          super___shared_ptr<cppcms::impl::cgi::scgi,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
      *pvVar3 = '\0';
      pvVar3 = std::vector<char,_std::allocator<char>_>::front(in_stack_fffffffffffffed0);
      local_64 = atoi(pvVar3);
      if ((local_64 < 0) || (0x4000 < local_64)) {
        std::error_code::error_code(&local_78,1,(error_category *)&cppcms_category);
        booster::callback<void_(const_std::error_code_&)>::operator()
                  ((callback<void_(const_std::error_code_&)> *)in_stack_fffffffffffffef0,local_20);
      }
      else {
        local_80 = local_18;
        std::vector<char,_std::allocator<char>_>::resize
                  (in_stack_fffffffffffffef0,(size_type)in_stack_fffffffffffffee8._M_current);
        sVar4 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x17));
        if (local_80 < sVar4) {
          c = &in_RDI[0x11].super___shared_ptr<cppcms::impl::cgi::scgi,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
          this_00 = (vector<char,_std::allocator<char>_> *)(in_RDI + 0x17);
          std::vector<char,_std::allocator<char>_>::operator[](this_00,local_80);
          std::vector<char,_std::allocator<char>_>::size(this_00);
          booster::aio::buffer(in_RDI,(size_t)in_stack_fffffffffffffef0);
          self((scgi *)in_stack_fffffffffffffee8._M_current);
          mfunc_to_io_handler<cppcms::impl::cgi::scgi,std::shared_ptr<cppcms::impl::cgi::scgi>,booster::callback<void(std::error_code_const&)>const&,booster::callback<void(std::error_code_const&)>>
                    ((offset_in_scgi_to_subr)on_headers_chunk_read,in_RDI,
                     (callback<void_(const_std::error_code_&)> *)in_stack_fffffffffffffef0);
          booster::callback<void(std::error_code_const&,unsigned_long)>::
          callback<booster::callable<void(std::error_code_const&,unsigned_long)>>
                    ((callback<void_(const_std::error_code_&,_unsigned_long)> *)this_00,
                     (intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>
                      *)c);
          booster::aio::stream_socket::async_read((mutable_buffer *)c,local_c0);
          booster::callback<void_(const_std::error_code_&,_unsigned_long)>::~callback
                    ((callback<void_(const_std::error_code_&,_unsigned_long)> *)0x495486);
          booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>
          ::~intrusive_ptr((intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>
                            *)this_00);
          std::shared_ptr<cppcms::impl::cgi::scgi>::~shared_ptr
                    ((shared_ptr<cppcms::impl::cgi::scgi> *)0x49549a);
          booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x4954a4);
        }
        else {
          std::error_code::error_code(&local_90,1,(error_category *)&cppcms_category);
          booster::callback<void_(const_std::error_code_&)>::operator()
                    ((callback<void_(const_std::error_code_&)> *)in_stack_fffffffffffffef0,
                     (error_code *)in_stack_fffffffffffffee8._M_current);
        }
      }
    }
    else {
      std::error_code::error_code(&local_60,1,(error_category *)&cppcms_category);
      booster::callback<void_(const_std::error_code_&)>::operator()
                ((callback<void_(const_std::error_code_&)> *)local_20,
                 (error_code *)in_stack_fffffffffffffee8._M_current);
    }
  }
  return;
}

Assistant:

void on_first_read(booster::system::error_code const &e,size_t n,handler const &h)
		{
			if(e) {
				h(e);
				return;
			}
			sep_=std::find(buffer_.begin(),buffer_.begin()+n,':') - buffer_.begin();
			if(sep_ >= 16) {
				h(booster::system::error_code(errc::protocol_violation,cppcms_category));
				return;
			}
			buffer_[sep_]=0;
			int len=atoi(&buffer_.front());
			if(len < 0 || 16384 < len) {
				h(booster::system::error_code(errc::protocol_violation,cppcms_category));
				return;
			}
			size_t size=n;
			buffer_.resize(sep_ + 2 + len); // len of number + ':' + content + ','
			if(buffer_.size() <= size) {
				// It can't be so short so
				h(booster::system::error_code(errc::protocol_violation,cppcms_category));
				return;
			}
			socket_.async_read(
				io::buffer(&buffer_[size],buffer_.size() - size),
					mfunc_to_io_handler(
						&scgi::on_headers_chunk_read,
						self(),
						h));
		}